

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall
test_opt_step_adamw::build_graph(test_opt_step_adamw *this,ggml_context *ctx)

{
  const_reference pvVar1;
  size_type *psVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  ggml_tensor *pgVar7;
  test_case *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *adamw_params;
  ggml_tensor *grad_v;
  ggml_tensor *grad_m;
  ggml_tensor *grad;
  ggml_tensor *a;
  size_type in_stack_ffffffffffffff08;
  size_type sVar8;
  value_type_conflict3 vVar9;
  array<long,_4UL> *in_stack_ffffffffffffff10;
  test_case *ne2;
  undefined4 in_stack_ffffffffffffff20;
  ggml_type type;
  ggml_context *ctx_00;
  test_case *this_00;
  ggml_context *ctx_01;
  test_case *in_stack_ffffffffffffff40;
  test_case *this_01;
  int64_t in_stack_ffffffffffffff50;
  value_type_conflict3 ne3;
  
  type = *(ggml_type *)(in_RDI + 0x38);
  ne2 = in_RSI;
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ctx_00 = (ggml_context *)*pvVar1;
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this_00 = (test_case *)*pvVar1;
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ctx_01 = (ggml_context *)*pvVar1;
  psVar2 = (size_type *)
           std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  sVar8 = *psVar2;
  pgVar3 = test_case::ggml_new_tensor_4d
                     (in_stack_ffffffffffffff40,ctx_01,(ggml_type)((ulong)this_00 >> 0x20),
                      (int64_t)ctx_00,CONCAT44(type,in_stack_ffffffffffffff20),(int64_t)ne2,
                      in_stack_ffffffffffffff50);
  ggml_set_param(in_RSI,pgVar3);
  ggml_set_name(pgVar3,"a");
  this_01 = in_RSI;
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  ne3 = *pvVar1;
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  psVar2 = (size_type *)std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  sVar8 = *psVar2;
  pgVar4 = test_case::ggml_new_tensor_4d
                     (this_01,ctx_01,(ggml_type)((ulong)this_00 >> 0x20),(int64_t)ctx_00,
                      CONCAT44(type,in_stack_ffffffffffffff20),(int64_t)ne2,ne3);
  ggml_set_name(pgVar4,"grad");
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  psVar2 = (size_type *)std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  sVar8 = *psVar2;
  pgVar5 = test_case::ggml_new_tensor_4d
                     (this_01,ctx_01,(ggml_type)((ulong)this_00 >> 0x20),(int64_t)ctx_00,
                      CONCAT44(type,in_stack_ffffffffffffff20),(int64_t)ne2,ne3);
  ggml_set_name(pgVar5,"grad_m");
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  pvVar1 = std::array<long,_4UL>::operator[](in_stack_ffffffffffffff10,sVar8);
  vVar9 = *pvVar1;
  pgVar6 = test_case::ggml_new_tensor_4d
                     (this_01,ctx_01,(ggml_type)((ulong)this_00 >> 0x20),(int64_t)ctx_00,
                      CONCAT44(type,in_stack_ffffffffffffff20),(int64_t)ne2,ne3);
  ggml_set_name(pgVar6,"grad_v");
  pgVar7 = test_case::ggml_new_tensor_1d(this_00,ctx_00,type,(int64_t)ne2);
  ggml_set_name(pgVar7,"adamw_params");
  pgVar3 = (ggml_tensor *)ggml_opt_step_adamw(in_RSI,pgVar3,pgVar4,pgVar5,pgVar6,pgVar7,vVar9);
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_param(ctx, a); // Despite tensor a having gradients the output tensor will not.
        ggml_set_name(a, "a");

        ggml_tensor * grad = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad, "grad");

        ggml_tensor * grad_m = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_m, "grad_m");

        ggml_tensor * grad_v = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_v, "grad_v");

        ggml_tensor * adamw_params = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 7);
        ggml_set_name(adamw_params, "adamw_params");

        ggml_tensor * out = ggml_opt_step_adamw(ctx, a, grad, grad_m, grad_v, adamw_params);
        ggml_set_name(out, "out");

        return out;
    }